

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O2

string * __thiscall
HTTPRequest::ReadBody_abi_cxx11_(string *__return_storage_ptr__,HTTPRequest *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  allocator<char> *__a;
  long in_FS_OFFSET;
  allocator<char> local_22;
  allocator<char> local_21;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = evhttp_request_get_input_buffer(this->req);
  if (lVar1 == 0) {
    __a = &local_21;
  }
  else {
    lVar2 = evbuffer_get_length(lVar1);
    lVar3 = evbuffer_pullup(lVar1,lVar2);
    if (lVar3 != 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,lVar3,lVar3 + lVar2);
      evbuffer_drain(lVar1,lVar2);
      goto LAB_006ce14c;
    }
    __a = &local_22;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",__a);
LAB_006ce14c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string HTTPRequest::ReadBody()
{
    struct evbuffer* buf = evhttp_request_get_input_buffer(req);
    if (!buf)
        return "";
    size_t size = evbuffer_get_length(buf);
    /** Trivial implementation: if this is ever a performance bottleneck,
     * internal copying can be avoided in multi-segment buffers by using
     * evbuffer_peek and an awkward loop. Though in that case, it'd be even
     * better to not copy into an intermediate string but use a stream
     * abstraction to consume the evbuffer on the fly in the parsing algorithm.
     */
    const char* data = (const char*)evbuffer_pullup(buf, size);
    if (!data) // returns nullptr in case of empty buffer
        return "";
    std::string rv(data, size);
    evbuffer_drain(buf, size);
    return rv;
}